

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O1

UINT8 okim6295_r(void *chip,UINT8 offset)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  okim6295_state *info;
  char *pcVar4;
  
  pcVar4 = (char *)((long)chip + 0x38);
  bVar1 = 0xf0;
  lVar2 = 0;
  do {
    bVar3 = (byte)(1 << ((byte)lVar2 & 0x1f));
    if (*pcVar4 == '\0') {
      bVar3 = 0;
    }
    bVar1 = bVar1 | bVar3;
    lVar2 = lVar2 + 1;
    pcVar4 = pcVar4 + 0x30;
  } while (lVar2 != 4);
  return bVar1;
}

Assistant:

static UINT8 okim6295_r(void* chip, UINT8 offset)
{
	okim6295_state *info = (okim6295_state *)chip;
	int voicenum;
	UINT8 result;

	result = 0xf0;  // naname expects bits 4-7 to be 1

	// set the bit to 1 if something is playing on a given channel
	for (voicenum = 0; voicenum < OKIM6295_VOICES; voicenum++)
		if (info->voice[voicenum].playing)
			result |= 1 << voicenum;

	return result;
}